

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIEnvironment::clear(CGUIEnvironment *this)

{
  undefined1 *puVar1;
  code *pcVar2;
  IGUIElement *pIVar3;
  _func_int *p_Var4;
  int iVar5;
  undefined4 extraout_var;
  
  pIVar3 = this->Focus;
  if (pIVar3 != (IGUIElement *)0x0) {
    p_Var4 = (pIVar3->super_IEventReceiver)._vptr_IEventReceiver[-3];
    pcVar2 = p_Var4 + 8 +
             (long)&(pIVar3->Children).
                    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
    ;
    *(int *)pcVar2 = *(int *)pcVar2 + -1;
    if (*(int *)pcVar2 == 0) {
      (**(code **)(*(long *)(p_Var4 + (long)&(pIVar3->super_IEventReceiver)._vptr_IEventReceiver) +
                  8))();
    }
    this->Focus = (IGUIElement *)0x0;
  }
  pIVar3 = this->Hovered;
  puVar1 = &(this->super_IGUIEnvironment).field_0x8;
  if (pIVar3 != (IGUIElement *)puVar1 && pIVar3 != (IGUIElement *)0x0) {
    p_Var4 = (pIVar3->super_IEventReceiver)._vptr_IEventReceiver[-3];
    pcVar2 = p_Var4 + 8 +
             (long)&(pIVar3->Children).
                    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
    ;
    *(int *)pcVar2 = *(int *)pcVar2 + -1;
    if (*(int *)pcVar2 == 0) {
      (**(code **)(*(long *)(p_Var4 + (long)&(pIVar3->super_IEventReceiver)._vptr_IEventReceiver) +
                  8))();
    }
    this->Hovered = (IGUIElement *)0x0;
  }
  pIVar3 = this->HoveredNoSubelement;
  if (pIVar3 != (IGUIElement *)puVar1 && pIVar3 != (IGUIElement *)0x0) {
    p_Var4 = (pIVar3->super_IEventReceiver)._vptr_IEventReceiver[-3];
    pcVar2 = p_Var4 + 8 +
             (long)&(pIVar3->Children).
                    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
    ;
    *(int *)pcVar2 = *(int *)pcVar2 + -1;
    if (*(int *)pcVar2 == 0) {
      (**(code **)(*(long *)(p_Var4 + (long)&(pIVar3->super_IEventReceiver)._vptr_IEventReceiver) +
                  8))();
    }
    this->HoveredNoSubelement = (IGUIElement *)0x0;
  }
  iVar5 = (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0x16])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x40))((long *)CONCAT44(extraout_var,iVar5));
  return;
}

Assistant:

void CGUIEnvironment::clear()
{
	// Remove the focus
	if (Focus) {
		Focus->drop();
		Focus = 0;
	}

	if (Hovered && Hovered != this) {
		Hovered->drop();
		Hovered = 0;
	}
	if (HoveredNoSubelement && HoveredNoSubelement != this) {
		HoveredNoSubelement->drop();
		HoveredNoSubelement = 0;
	}

	getRootGUIElement()->removeAllChildren();
}